

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O2

bool absl::anon_unknown_0::ParseInfinityOrNan(char *begin,char *end,ParsedFloat *out)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  char *pcVar5;
  
  if ((long)end - (long)begin < 3) {
    return false;
  }
  cVar1 = *begin;
  if (cVar1 != 'I') {
    if ((cVar1 == 'N') || (cVar1 == 'n')) {
      iVar3 = strings_internal::memcasecmp(begin + 1,"an",2);
      if (iVar3 != 0) {
        return false;
      }
      out->type = kNan;
      pcVar5 = begin + 3;
      out->end = pcVar5;
      if (end <= pcVar5) {
        return true;
      }
      if (*pcVar5 != '(') {
        return true;
      }
      pbVar4 = (byte *)(begin + 4);
      while( true ) {
        if (end <= pbVar4) {
          return true;
        }
        bVar2 = *pbVar4;
        if (((0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) && (bVar2 != 0x5f)) &&
           (9 < (byte)(bVar2 - 0x30))) break;
        pbVar4 = pbVar4 + 1;
      }
      if (bVar2 == 0x29) {
        out->subrange_begin = begin + 4;
        out->subrange_end = (char *)pbVar4;
        out->end = (char *)(pbVar4 + 1);
        return true;
      }
      return true;
    }
    if (cVar1 != 'i') {
      return false;
    }
  }
  iVar3 = strings_internal::memcasecmp(begin + 1,"nf",2);
  if (iVar3 != 0) {
    return false;
  }
  out->type = kInfinity;
  if (((ulong)((long)end - (long)begin) < 8) ||
     (iVar3 = strings_internal::memcasecmp(begin + 3,"inity",5), iVar3 != 0)) {
    pcVar5 = begin + 3;
  }
  else {
    pcVar5 = begin + 8;
  }
  out->end = pcVar5;
  return true;
}

Assistant:

bool ParseInfinityOrNan(const char* begin, const char* end,
                        strings_internal::ParsedFloat* out) {
  if (end - begin < 3) {
    return false;
  }
  switch (*begin) {
    case 'i':
    case 'I': {
      // An infinity string consists of the characters "inf" or "infinity",
      // case insensitive.
      if (strings_internal::memcasecmp(begin + 1, "nf", 2) != 0) {
        return false;
      }
      out->type = strings_internal::FloatType::kInfinity;
      if (end - begin >= 8 &&
          strings_internal::memcasecmp(begin + 3, "inity", 5) == 0) {
        out->end = begin + 8;
      } else {
        out->end = begin + 3;
      }
      return true;
    }
    case 'n':
    case 'N': {
      // A NaN consists of the characters "nan", case insensitive, optionally
      // followed by a parenthesized sequence of zero or more alphanumeric
      // characters and/or underscores.
      if (strings_internal::memcasecmp(begin + 1, "an", 2) != 0) {
        return false;
      }
      out->type = strings_internal::FloatType::kNan;
      out->end = begin + 3;
      // NaN is allowed to be followed by a parenthesized string, consisting of
      // only the characters [a-zA-Z0-9_].  Match that if it's present.
      begin += 3;
      if (begin < end && *begin == '(') {
        const char* nan_begin = begin + 1;
        while (nan_begin < end && IsNanChar(*nan_begin)) {
          ++nan_begin;
        }
        if (nan_begin < end && *nan_begin == ')') {
          // We found an extra NaN specifier range
          out->subrange_begin = begin + 1;
          out->subrange_end = nan_begin;
          out->end = nan_begin + 1;
        }
      }
      return true;
    }
    default:
      return false;
  }
}